

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

void irafswap8(char *string,int nbytes)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char temp [8];
  char *slast;
  char *sbyte;
  int nbytes_local;
  char *string_local;
  
  for (sbyte = string; sbyte < string + nbytes; sbyte = sbyte + 8) {
    cVar1 = *sbyte;
    cVar2 = sbyte[1];
    cVar3 = sbyte[2];
    cVar4 = sbyte[3];
    *sbyte = sbyte[7];
    sbyte[1] = sbyte[6];
    sbyte[2] = sbyte[5];
    sbyte[3] = sbyte[4];
    sbyte[4] = cVar4;
    sbyte[5] = cVar3;
    sbyte[6] = cVar2;
    sbyte[7] = cVar1;
  }
  return;
}

Assistant:

static void irafswap8 (

char *string,	/* Address of Real*8 vector */
int nbytes)	/* Number of bytes to reverse */

{
    char *sbyte, *slast;
    char temp[8];

    slast = string + nbytes;
    sbyte = string;
    while (sbyte < slast) {
	temp[7] = sbyte[0];
	temp[6] = sbyte[1];
	temp[5] = sbyte[2];
	temp[4] = sbyte[3];
	temp[3] = sbyte[4];
	temp[2] = sbyte[5];
	temp[1] = sbyte[6];
	temp[0] = sbyte[7];
	sbyte[0] = temp[0];
	sbyte[1] = temp[1];
	sbyte[2] = temp[2];
	sbyte[3] = temp[3];
	sbyte[4] = temp[4];
	sbyte[5] = temp[5];
	sbyte[6] = temp[6];
	sbyte[7] = temp[7];
	sbyte = sbyte + 8;
	}
    return;
}